

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::allocateBuckets(DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
                  *this,uint Num)

{
  int iVar1;
  void *pvVar2;
  uint Num_local;
  DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
  *this_local;
  
  *(uint *)(this + 0x10) = Num;
  iVar1 = *(int *)(this + 0x10);
  if (iVar1 != 0) {
    pvVar2 = operator_new((ulong)*(uint *)(this + 0x10) << 4);
    *(void **)this = pvVar2;
  }
  else {
    *(undefined8 *)this = 0;
  }
  return iVar1 != 0;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT*>(operator new(sizeof(BucketT) * NumBuckets));
    return true;
  }